

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

void __thiscall
QFontCache::insertEngineData(QFontCache *this,QFontDef *def,QFontEngineData *engineData)

{
  QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
  *pQVar1;
  long in_FS_OFFSET;
  QFontEngineData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  (engineData->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (engineData->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_20 = engineData;
  if (((0x2000 < this->total_cost) &&
      (pQVar1 = (this->engineDataCache).d.d.ptr,
      pQVar1 != (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
                 *)0x0)) &&
     (0xff < (long)(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
    decreaseCache(this);
  }
  QMap<QFontDef,_QFontEngineData_*>::insert(&this->engineDataCache,def,&local_20);
  increaseCost(this,0x568);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::insertEngineData(const QFontDef &def, QFontEngineData *engineData)
{
#ifdef QFONTCACHE_DEBUG
    FC_DEBUG("QFontCache: inserting new engine data %p", engineData);
    if (engineDataCache.contains(def)) {
        FC_DEBUG("   QFontCache already contains engine data %p for key=(%g %g %d %d %d)",
                 engineDataCache.value(def), def.pointSize,
                 def.pixelSize, def.weight, def.style, def.fixedPitch);
    }
#endif
    Q_ASSERT(!engineDataCache.contains(def));

    engineData->ref.ref();
    // Decrease now rather than waiting
    if (total_cost > min_cost * 2 && engineDataCache.size() >= QFONTCACHE_DECREASE_TRIGGER_LIMIT)
        decreaseCache();

    engineDataCache.insert(def, engineData);
    increaseCost(sizeof(QFontEngineData));
}